

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  string_view text;
  string_view text_00;
  SourceBuffer buffer;
  Token token_00;
  bool bVar1;
  reference pSVar2;
  reference ppDVar3;
  Token TVar4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  Bag *in_stack_00000068;
  Driver *in_stack_00000070;
  SyntaxPrinter printer;
  DefineDirectiveSyntax *macro;
  iterator __end2;
  iterator __begin2;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  *__range2;
  Token token;
  reverse_iterator it;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  Preprocessor preprocessor;
  Diagnostics diagnostics;
  BumpAllocator alloc;
  Bag optionBag;
  SyntaxPrinter *this_00;
  BumpAllocator *in_stack_fffffffffffff8c0;
  Preprocessor *this_01;
  SourceLibrary *in_stack_fffffffffffff8c8;
  Info *in_stack_fffffffffffff8d0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff8e0;
  __extent_storage<18446744073709551615UL> this_02;
  pointer in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  undefined1 uVar6;
  SyntaxPrinter *this_03;
  undefined8 in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  undefined1 *puVar7;
  Preprocessor *in_stack_fffffffffffff948;
  SourceLoader *in_stack_fffffffffffff9b8;
  SyntaxPrinter local_628;
  DefineDirectiveSyntax *local_5f8;
  DefineDirectiveSyntax **local_5f0;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  local_5e8;
  undefined1 local_5e0 [24];
  undefined1 *local_5c8;
  Token local_5c0;
  SyntaxPrinter *local_5a8;
  Preprocessor *in_stack_fffffffffffffa60;
  SourceLibrary *in_stack_fffffffffffffa68;
  Info *in_stack_fffffffffffffa70;
  undefined1 local_588 [40];
  SyntaxPrinter *local_560;
  Preprocessor *pPStack_558;
  format_args in_stack_fffffffffffffb20;
  string_view in_stack_fffffffffffffb30;
  Bag *in_stack_fffffffffffffe08;
  Diagnostics *in_stack_fffffffffffffe10;
  BumpAllocator *in_stack_fffffffffffffe18;
  SourceManager *in_stack_fffffffffffffe20;
  Preprocessor *in_stack_fffffffffffffe28;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_ffffffffffffffa0;
  
  Bag::Bag((Bag *)0x22bfd4);
  addParseOptions(in_stack_00000070,in_stack_00000068);
  BumpAllocator::BumpAllocator(in_stack_fffffffffffff8c0);
  Diagnostics::Diagnostics((Diagnostics *)0x22c00c);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x22c02c);
  parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_ffffffffffffffa0);
  SourceLoader::loadSources(in_stack_fffffffffffff9b8);
  std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rbegin
            ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
             in_stack_fffffffffffff8c8);
  this_00 = local_560;
  this_01 = pPStack_558;
  while( true ) {
    puVar7 = local_588;
    std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rend
              ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
               in_stack_fffffffffffff8c8);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                        *)in_stack_fffffffffffff8d0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                        *)in_stack_fffffffffffff8c8);
    TVar4.info = local_5c0.info;
    TVar4.kind = local_5c0.kind;
    TVar4._2_1_ = local_5c0._2_1_;
    TVar4.numFlags.raw = local_5c0.numFlags.raw;
    TVar4.rawLen = local_5c0.rawLen;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                          *)this_01);
    this_00 = (SyntaxPrinter *)(pSVar2->data)._M_len;
    this_01 = (Preprocessor *)(pSVar2->data)._M_str;
    in_stack_fffffffffffff8c8 = pSVar2->library;
    in_stack_fffffffffffff8d0 = *(Info **)&pSVar2->id;
    buffer.data._M_str = (char *)in_stack_fffffffffffff908;
    buffer.data._M_len = in_stack_fffffffffffff900;
    buffer.library = (SourceLibrary *)pSVar2;
    buffer._24_8_ = puVar7;
    local_5a8 = this_00;
    in_stack_fffffffffffffa60 = this_01;
    in_stack_fffffffffffffa68 = in_stack_fffffffffffff8c8;
    in_stack_fffffffffffffa70 = in_stack_fffffffffffff8d0;
    parsing::Preprocessor::pushSource
              ((Preprocessor *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),buffer)
    ;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                  *)in_stack_fffffffffffff8c8,(int)((ulong)this_01 >> 0x20));
  }
  do {
    local_5c0 = TVar4;
    TVar4 = parsing::Preprocessor::next((Preprocessor *)0x22c1c5);
    local_5c0.kind = TVar4.kind;
  } while (local_5c0.kind != EndOfFile);
  local_5c0 = TVar4;
  parsing::Preprocessor::getDefinedMacros(in_stack_fffffffffffff948);
  local_5c8 = local_5e0;
  local_5e8._M_current =
       (DefineDirectiveSyntax **)
       std::
       vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
       ::begin((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                *)this_00);
  local_5f0 = (DefineDirectiveSyntax **)
              std::
              vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              ::end((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                     *)this_00);
  sVar5._M_extent._M_extent_value = in_stack_fffffffffffff8e0._M_extent_value;
  sVar5._M_ptr = in_stack_fffffffffffff8e8;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
                      ((__normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
                        *)this_01,
                       (__normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
              ::operator*(&local_5e8);
    local_5f8 = *ppDVar3;
    this_03 = &local_628;
    slang::syntax::SyntaxPrinter::SyntaxPrinter((SyntaxPrinter *)this_01);
    slang::syntax::SyntaxPrinter::setIncludeComments(this_03,false);
    slang::syntax::SyntaxPrinter::setIncludeTrivia(&local_628,false);
    token_00.info = in_stack_fffffffffffffa70;
    token_00._0_8_ = in_stack_fffffffffffffa68;
    slang::syntax::SyntaxPrinter::print((SyntaxPrinter *)in_stack_fffffffffffffa60,token_00);
    slang::syntax::SyntaxPrinter::setIncludeTrivia(&local_628,true);
    if (local_5f8->formalArguments != (MacroFormalArgumentListSyntax *)0x0) {
      slang::syntax::SyntaxPrinter::print((SyntaxPrinter *)TVar4.info,(SyntaxNode *)this_03);
    }
    bVar1 = std::span<slang::parsing::Token,_18446744073709551615UL>::empty
                      ((span<slang::parsing::Token,_18446744073709551615UL> *)0x22c362);
    this_02 = sVar5._M_extent._M_extent_value;
    uVar6 = false;
    if (!bVar1) {
      std::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                (&(local_5f8->body).super_span<slang::parsing::Token,_18446744073709551615UL>,0);
      sVar5 = parsing::Token::trivia((Token *)this_02._M_extent_value);
      uVar6 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x22c3bf);
    }
    if ((bool)uVar6 != false) {
      sv((char *)this_01,(size_t)this_00);
      text_00._M_len._7_1_ = uVar6;
      text_00._M_len._0_7_ = in_stack_fffffffffffff8f0;
      text_00._M_str = (char *)this_03;
      slang::syntax::SyntaxPrinter::append((SyntaxPrinter *)sVar5._M_ptr,text_00);
    }
    slang::syntax::SyntaxPrinter::print((SyntaxPrinter *)TVar4.info,(SyntaxNode *)this_03);
    slang::syntax::SyntaxPrinter::str_abi_cxx11_(this_00);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffff8d0,
               &in_stack_fffffffffffff8c8->name);
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb30,in_stack_fffffffffffffb20);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    text._M_str = (char *)in_stack_fffffffffffff8d0;
    text._M_len = (size_t)in_stack_fffffffffffff8c8;
    OS::print(text);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    slang::syntax::SyntaxPrinter::~SyntaxPrinter((SyntaxPrinter *)0x22c58a);
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
    ::operator++(&local_5e8);
  }
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~vector((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             *)in_stack_fffffffffffff8d0);
  std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::~vector
            ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
             in_stack_fffffffffffff8d0);
  parsing::Preprocessor::~Preprocessor(this_01);
  Diagnostics::~Diagnostics((Diagnostics *)0x22c623);
  BumpAllocator::~BumpAllocator((BumpAllocator *)this_01);
  Bag::~Bag((Bag *)0x22c63d);
  return;
}

Assistant:

void Driver::reportMacros() {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}